

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageField
          (Parser *this,FieldDescriptorProto *field,
          RepeatedPtrField<google::protobuf::DescriptorProto> *messages,
          LocationRecorder *parent_location,int location_field_number_for_nested_type,
          LocationRecorder *field_location,FileDescriptorProto *containing_file)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  Label in_register_00000004;
  Label label;
  Label local_34;
  
  local_34 = in_register_00000004;
  bVar2 = ParseLabel(this,&local_34,field_location,(FileDescriptorProto *)parent_location);
  if (bVar2) {
    bVar2 = FieldDescriptorProto_Label_IsValid(local_34);
    if (!bVar2) {
      __assert_fail("::PROTOBUF_NAMESPACE_ID::FieldDescriptorProto_Label_IsValid(value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.h"
                    ,0x2793,
                    "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
                   );
    }
    pbVar1 = (byte *)((long)(field->_has_bits_).has_bits_ + 1);
    *pbVar1 = *pbVar1 | 2;
    field->label_ = local_34;
    if (local_34 == FieldDescriptorProto_Label_LABEL_OPTIONAL) {
      iVar3 = std::__cxx11::string::compare((char *)&this->syntax_identifier_);
      if (iVar3 == 0) {
        pbVar1 = (byte *)((long)(field->_has_bits_).has_bits_ + 1);
        *pbVar1 = *pbVar1 | 1;
        field->proto3_optional_ = true;
      }
    }
  }
  bVar2 = ParseMessageFieldNoLabel
                    (this,field,messages,parent_location,location_field_number_for_nested_type,
                     field_location,containing_file);
  return bVar2;
}

Assistant:

bool Parser::ParseMessageField(FieldDescriptorProto* field,
                               RepeatedPtrField<DescriptorProto>* messages,
                               const LocationRecorder& parent_location,
                               int location_field_number_for_nested_type,
                               const LocationRecorder& field_location,
                               const FileDescriptorProto* containing_file) {
  {
    FieldDescriptorProto::Label label;
    if (ParseLabel(&label, field_location, containing_file)) {
      field->set_label(label);
      if (label == FieldDescriptorProto::LABEL_OPTIONAL &&
          syntax_identifier_ == "proto3") {
        field->set_proto3_optional(true);
      }
    }
  }

  return ParseMessageFieldNoLabel(field, messages, parent_location,
                                  location_field_number_for_nested_type,
                                  field_location, containing_file);
}